

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O3

void localUnref(mpt_metatype *mt)

{
  long lVar1;
  
  lVar1 = mpt_refcount_lower(mt + 4);
  if (lVar1 != 0) {
    return;
  }
  mpt_history_fini((mpt_history *)(mt + 6));
  if (mt[5]._vptr != (_mpt_vptr_metatype *)0x0) {
    (**(code **)(((mt[5]._vptr)->convertable).convert + 8))();
  }
  free(mt);
  return;
}

Assistant:

static void localUnref(MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(local_output) *lo = (void *) mt;
	
	/* remove active reference */
	if (mpt_refcount_lower(&lo->ref)) {
		return;
	}
	mpt_history_fini(&lo->hist);
	
	if ((mt = (void *) lo->pass)) {
		mt->_vptr->unref(mt);
	}
	free(lo);
}